

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflatePrime(z_streamp strm,int bits,int value)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  int value_local;
  int bits_local;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    if (bits == 0) {
      strm_local._4_4_ = 0;
    }
    else {
      piVar1 = strm->state;
      if (bits < 0) {
        piVar1->crc0[0] = 0;
        piVar1->crc0[1] = 0;
        piVar1->crc0[2] = 0;
        strm_local._4_4_ = 0;
      }
      else if ((bits < 0x11) && (piVar1->crc0[2] + bits < 0x21)) {
        *(ulong *)piVar1->crc0 =
             (ulong)((value & (int)(1L << ((byte)bits & 0x3f)) - 1U) <<
                    ((byte)piVar1->crc0[2] & 0x1f)) + *(long *)piVar1->crc0;
        piVar1->crc0[2] = bits + piVar1->crc0[2];
        strm_local._4_4_ = 0;
      }
      else {
        strm_local._4_4_ = -2;
      }
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflatePrime(z_streamp strm, int bits, int value) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    if (bits == 0)
        return Z_OK;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (uInt)bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (unsigned)value << state->bits;
    state->bits += (uInt)bits;
    return Z_OK;
}